

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  StructReader value;
  ListReader value_00;
  ListReader value_01;
  undefined4 elementCount_00;
  word *pwVar1;
  word *ptr_00;
  WirePointer *pWVar2;
  CapTableReader *pCVar3;
  SegmentReader *pSVar4;
  WirePointer *pWVar5;
  CapTableBuilder *pCVar6;
  bool bVar7;
  unsigned_short pointerCount_00;
  unsigned_short uVar8;
  unsigned_short uVar9;
  Kind KVar10;
  WordCountN<17> size;
  BitsPerElementN<23> step_00;
  BitsPerElementTableType structDataSize;
  PointersPerElementN<1> PVar11;
  ElementCountN<29> i;
  uint uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  WordCount64 WVar15;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar16;
  SegmentAnd<capnp::word_*> SVar17;
  Fault local_2e8;
  Fault f_12;
  Own<capnp::ClientHook,_std::nullptr_t> *cap;
  undefined1 local_2c0 [8];
  OwnOwn<capnp::ClientHook,_std::nullptr_t> _cap2091;
  Fault f_11;
  Fault f_10;
  DebugExpression<bool> _kjCondition_9;
  Fault f_9;
  CapTableReader *pCStack_288;
  byte *local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  Fault local_260;
  Fault f_8;
  DebugExpression<bool> _kjCondition_8;
  Fault f_7;
  DebugExpression<bool> _kjCondition_7;
  WordCount64 wordCount_1;
  ElementCountN<29> elementCount_1;
  uint step;
  uint pointerCount;
  uint dataSize;
  CapTableReader *pCStack_220;
  byte *local_218;
  undefined8 uStack_210;
  StructDataBitCount local_208;
  StructPointerCount SStack_204;
  ElementSize EStack_202;
  undefined1 uStack_201;
  int iStack_200;
  undefined4 uStack_1fc;
  Fault local_1f8;
  Fault f_6;
  DebugExpression<bool> _kjCondition_6;
  Fault f_5;
  DebugExpression<unsigned_long> local_1d8;
  undefined1 local_1d0 [8];
  DebugComparison<unsigned_long,_unsigned_int_&> _kjCondition_5;
  uint wordsPerElement;
  ListElementCount elementCount;
  Fault f_4;
  Kind local_190;
  DebugExpression<capnp::_::WirePointer::Kind> local_18c;
  undefined1 local_188 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_4;
  Fault f_3;
  DebugExpression<bool> _kjCondition_3;
  WirePointer *tag;
  WordCountN<29> wordCount;
  Fault f_2;
  int *local_138;
  undefined1 local_130 [8];
  DebugComparison<int_&,_int> _kjCondition_2;
  undefined1 auStack_100 [7];
  ElementSize elementSize;
  CapTableReader *pCStack_f8;
  void *local_f0;
  WirePointer *pWStack_e8;
  StructDataBitCount local_e0;
  StructPointerCount SStack_dc;
  undefined2 uStack_da;
  int iStack_d8;
  undefined4 uStack_d4;
  Fault local_d0;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_b8;
  Fault f;
  int *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<int_&,_int> _kjCondition;
  word *p;
  word *local_68;
  word *_p1971;
  word *ptr;
  WirePointer *pWStack_50;
  bool canonical_local;
  WirePointer *src_local;
  CapTableReader *srcCapTable_local;
  SegmentReader *srcSegment_local;
  WirePointer *dst_local;
  CapTableBuilder *dstCapTable_local;
  SegmentBuilder *dstSegment_local;
  word *local_18;
  
  ptr._7_1_ = canonical;
  pWStack_50 = src;
  src_local = (WirePointer *)srcCapTable;
  srcCapTable_local = (CapTableReader *)srcSegment;
  srcSegment_local = (SegmentReader *)dst;
  dst_local = (WirePointer *)dstCapTable;
  dstCapTable_local = (CapTableBuilder *)dstSegment;
  bVar7 = WirePointer::isNull(src);
  if (!bVar7) {
    followFars((WireHelpers *)&p,&stack0xffffffffffffffb0,srcTarget,
               (SegmentReader **)&srcCapTable_local);
    local_68 = kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&p);
    if (local_68 != (word *)0x0) {
      _kjCondition._32_8_ = local_68;
      _p1971 = local_68;
      KVar10 = WirePointer::kind(pWStack_50);
      switch(KVar10) {
      case STRUCT:
        local_a8 = (int *)kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&nestingLimit);
        f.exception._4_4_ = 0;
        kj::_::DebugExpression<int&>::operator>
                  ((DebugComparison<int_&,_int> *)local_a0,(DebugExpression<int&> *)&local_a8,
                   (int *)((long)&f.exception + 4));
        bVar7 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
        pCVar3 = srcCapTable_local;
        pwVar1 = _p1971;
        if (bVar7) {
          size = WirePointer::StructRef::wordSize(&(pWStack_50->field_1).structRef);
          f_1.exception._2_1_ = boundsCheck((SegmentReader *)pCVar3,pwVar1,size);
          f_1.exception._3_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f_1.exception + 2));
          bVar7 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f_1.exception + 3));
          pCVar6 = dstCapTable_local;
          pWVar5 = dst_local;
          pSVar4 = srcSegment_local;
          pCVar3 = srcCapTable_local;
          pWVar2 = src_local;
          pwVar1 = _p1971;
          if (bVar7) {
            uVar8 = DirectWireValue<unsigned_short>::get(&(pWStack_50->field_1).structRef.dataSize);
            uVar9 = DirectWireValue<unsigned_short>::get(&(pWStack_50->field_1).structRef.dataSize);
            pointerCount_00 =
                 DirectWireValue<unsigned_short>::get(&(pWStack_50->field_1).structRef.ptrCount);
            StructReader::StructReader
                      ((StructReader *)auStack_100,(SegmentReader *)pCVar3,(CapTableReader *)pWVar2,
                       pwVar1,(WirePointer *)(pwVar1 + (int)(uint)uVar8),(uint)uVar9 << 6,
                       pointerCount_00,nestingLimit + -1);
            value.capTable._0_2_ = (short)pCStack_f8;
            value.segment = _auStack_100;
            value.capTable._2_2_ = (short)((ulong)pCStack_f8 >> 0x10);
            value.capTable._4_4_ = (int)((ulong)pCStack_f8 >> 0x20);
            value.data._0_4_ = (int)local_f0;
            value.data._4_4_ = (int)((ulong)local_f0 >> 0x20);
            value.pointers._0_4_ = (int)pWStack_e8;
            value.pointers._4_4_ = (int)((ulong)pWStack_e8 >> 0x20);
            value.dataSize = local_e0;
            value.pointerCount = SStack_dc;
            value._38_2_ = uStack_da;
            value.nestingLimit = iStack_d8;
            value._44_4_ = uStack_d4;
            SVar17 = setStructPointer((SegmentBuilder *)pCVar6,(CapTableBuilder *)pWVar5,
                                      (WirePointer *)pSVar4,value,orphanArena,(bool)(ptr._7_1_ & 1))
            ;
            return SVar17;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                    (&local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7c2,FAILED,"boundsCheck(srcSegment, ptr, src->structRef.wordSize())",
                     "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)((long)&f_1.exception + 3),
                     (char (*) [322])
                     "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault(&local_d0);
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                    (&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7bc,FAILED,"nestingLimit > 0",
                     "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                     ,(DebugComparison<int_&,_int> *)local_a0,
                     (char (*) [76])
                     "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
          kj::_::Debug::Fault::~Fault(&local_b8);
        }
        break;
      case LIST:
        _kjCondition_2._39_1_ = WirePointer::ListRef::elementSize(&(pWStack_50->field_1).listRef);
        local_138 = (int *)kj::_::DebugExpressionStart::operator<<
                                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&nestingLimit);
        f_2.exception._4_4_ = 0;
        kj::_::DebugExpression<int&>::operator>
                  ((DebugComparison<int_&,_int> *)local_130,(DebugExpression<int&> *)&local_138,
                   (int *)((long)&f_2.exception + 4));
        bVar7 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
        if (bVar7) {
          if (_kjCondition_2._39_1_ == '\a') {
            tag._4_4_ = WirePointer::ListRef::inlineCompositeWordCount
                                  (&(pWStack_50->field_1).listRef);
            pwVar1 = _p1971;
            f_3.exception._6_1_ =
                 boundsCheck((SegmentReader *)srcCapTable_local,_p1971,tag._4_4_ + 1);
            f_3.exception._7_1_ =
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (bool *)((long)&f_3.exception + 6));
            bVar7 = kj::_::DebugExpression::operator_cast_to_bool
                              ((DebugExpression *)((long)&f_3.exception + 7));
            if (bVar7) {
              _p1971 = _p1971 + 1;
              local_190 = WirePointer::kind((WirePointer *)pwVar1);
              local_18c = kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
              f_4.exception._4_4_ = 0;
              kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                        ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)local_188,&local_18c,(Kind *)((long)&f_4.exception + 4));
              bVar7 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
              if (bVar7) {
                _kjCondition_5._36_4_ =
                     WirePointer::inlineCompositeListElementCount((WirePointer *)pwVar1);
                _kjCondition_5._32_4_ =
                     WirePointer::StructRef::wordSize((StructRef *)((long)&pwVar1->content + 4));
                uVar13 = (ulong)(uint)_kjCondition_5._32_4_;
                uVar14 = upgradeBound<unsigned_long,unsigned_int>(_kjCondition_5._36_4_);
                f_5.exception = (Exception *)(uVar13 * uVar14);
                local_1d8 = kj::_::DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                       (unsigned_long *)&f_5);
                kj::_::DebugExpression<unsigned_long>::operator<=
                          ((DebugComparison<unsigned_long,_unsigned_int_&> *)local_1d0,&local_1d8,
                           (uint *)((long)&tag + 4));
                bVar7 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
                if (bVar7) {
                  if (_kjCondition_5._32_4_ == 0) {
                    f_6.exception._6_1_ =
                         amplifiedRead((SegmentReader *)srcCapTable_local,_kjCondition_5._36_4_);
                    f_6.exception._7_1_ =
                         kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                    (bool *)((long)&f_6.exception + 6));
                    bVar7 = kj::_::DebugExpression::operator_cast_to_bool
                                      ((DebugExpression *)((long)&f_6.exception + 7));
                    if (!bVar7) {
                      kj::_::Debug::Fault::
                      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                                (&local_1f8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                                 ,0x7f2,FAILED,
                                 "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))"
                                 ,"_kjCondition,\"Message contains amplified list pointer.\"",
                                 (DebugExpression<bool> *)((long)&f_6.exception + 7),
                                 (char (*) [41])"Message contains amplified list pointer.");
                      kj::_::Debug::Fault::~Fault(&local_1f8);
                      break;
                    }
                  }
                  pCVar6 = dstCapTable_local;
                  pWVar5 = dst_local;
                  pSVar4 = srcSegment_local;
                  pCVar3 = srcCapTable_local;
                  pWVar2 = src_local;
                  ptr_00 = _p1971;
                  elementCount_00 = _kjCondition_5._36_4_;
                  step_00 = _kjCondition_5._32_4_ << 6;
                  uVar8 = DirectWireValue<unsigned_short>::get
                                    ((DirectWireValue<unsigned_short> *)((long)&pwVar1->content + 4)
                                    );
                  uVar9 = DirectWireValue<unsigned_short>::get
                                    ((DirectWireValue<unsigned_short> *)((long)&pwVar1->content + 6)
                                    );
                  ListReader::ListReader
                            ((ListReader *)&pointerCount,(SegmentReader *)pCVar3,
                             (CapTableReader *)pWVar2,ptr_00,elementCount_00,step_00,
                             (uint)uVar8 << 6,uVar9,INLINE_COMPOSITE,nestingLimit + -1);
                  value_00.capTable._0_2_ = (short)pCStack_220;
                  value_00.segment = _pointerCount;
                  value_00.capTable._2_2_ = (short)((ulong)pCStack_220 >> 0x10);
                  value_00.capTable._4_4_ = (int)((ulong)pCStack_220 >> 0x20);
                  value_00.ptr._0_4_ = (int)local_218;
                  value_00.ptr._4_4_ = (int)((ulong)local_218 >> 0x20);
                  value_00.elementCount = (ListElementCount)uStack_210;
                  value_00.step = SUB84(uStack_210,4);
                  value_00.structDataSize = local_208;
                  value_00.structPointerCount = SStack_204;
                  value_00.elementSize = EStack_202;
                  value_00._39_1_ = uStack_201;
                  value_00.nestingLimit = iStack_200;
                  value_00._44_4_ = uStack_1fc;
                  SVar17 = setListPointer((SegmentBuilder *)pCVar6,(CapTableBuilder *)pWVar5,
                                          (WirePointer *)pSVar4,value_00,orphanArena,
                                          (bool)(ptr._7_1_ & 1));
                  return SVar17;
                }
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                          ((Fault *)&stack0xfffffffffffffe18,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x7ea,FAILED,
                           "wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount",
                           "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                           ,(DebugComparison<unsigned_long,_unsigned_int_&> *)local_1d0,
                           (char (*) [57])
                           "INLINE_COMPOSITE list\'s elements overrun its word count.");
                kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffe18);
              }
              else {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                          ((Fault *)&wordsPerElement,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x7e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                           "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                           ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                             *)local_188,
                           (char (*) [61])
                           "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
                kj::_::Debug::Fault::~Fault((Fault *)&wordsPerElement);
              }
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                        ((Fault *)&_kjCondition_4.result,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7db,FAILED,
                         "boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                         "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)((long)&f_3.exception + 7),
                         (char (*) [319])
                         "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_4.result);
            }
          }
          else {
            structDataSize = dataBitsPerElement(_kjCondition_2._39_1_);
            PVar11 = pointersPerElement(_kjCondition_2._39_1_);
            uVar12 = structDataSize + PVar11 * 0x40;
            i = WirePointer::ListRef::elementCount(&(pWStack_50->field_1).listRef);
            uVar14 = upgradeBound<unsigned_long,unsigned_int>(i);
            WVar15 = roundBitsUpToWords(uVar14 * uVar12);
            f_7.exception._6_1_ =
                 boundsCheck((SegmentReader *)srcCapTable_local,_p1971,(WordCountN<31>)WVar15);
            f_7.exception._7_1_ =
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (bool *)((long)&f_7.exception + 6));
            bVar7 = kj::_::DebugExpression::operator_cast_to_bool
                              ((DebugExpression *)((long)&f_7.exception + 7));
            if (bVar7) {
              if (_kjCondition_2._39_1_ == '\0') {
                f_8.exception._6_1_ = amplifiedRead((SegmentReader *)srcCapTable_local,i);
                f_8.exception._7_1_ =
                     kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (bool *)((long)&f_8.exception + 6));
                bVar7 = kj::_::DebugExpression::operator_cast_to_bool
                                  ((DebugExpression *)((long)&f_8.exception + 7));
                if (!bVar7) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            (&local_260,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x80f,FAILED,
                             "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                             "_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)((long)&f_8.exception + 7),
                             (char (*) [41])"Message contains amplified list pointer.");
                  kj::_::Debug::Fault::~Fault(&local_260);
                  break;
                }
              }
              pCVar6 = dstCapTable_local;
              pWVar2 = dst_local;
              pSVar4 = srcSegment_local;
              ListReader::ListReader
                        ((ListReader *)&f_9,(SegmentReader *)srcCapTable_local,
                         (CapTableReader *)src_local,_p1971,i,uVar12,structDataSize,
                         (StructPointerCount)PVar11,_kjCondition_2._39_1_,nestingLimit + -1);
              value_01.capTable._0_2_ = (short)pCStack_288;
              value_01.segment = (SegmentReader *)f_9.exception;
              value_01.capTable._2_2_ = (short)((ulong)pCStack_288 >> 0x10);
              value_01.capTable._4_4_ = (int)((ulong)pCStack_288 >> 0x20);
              value_01.ptr._0_4_ = (int)local_280;
              value_01.ptr._4_4_ = (int)((ulong)local_280 >> 0x20);
              value_01.elementCount = (ListElementCount)uStack_278;
              value_01.step = SUB84(uStack_278,4);
              value_01._32_8_ = local_270;
              value_01._40_8_ = uStack_268;
              SVar17 = setListPointer((SegmentBuilder *)pCVar6,(CapTableBuilder *)pWVar2,
                                      (WirePointer *)pSVar4,value_01,orphanArena,
                                      (bool)(ptr._7_1_ & 1));
              return SVar17;
            }
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                      ((Fault *)&stack0xfffffffffffffdb0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x807,FAILED,"boundsCheck(srcSegment, ptr, wordCount)",
                       "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)((long)&f_7.exception + 7),
                       (char (*) [319])
                       "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffdb0);
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                    ((Fault *)&stack0xfffffffffffffeb8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7d1,FAILED,"nestingLimit > 0",
                     "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                     ,(DebugComparison<int_&,_int> *)local_130,
                     (char (*) [76])
                     "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffeb8);
        }
        break;
      case FAR:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  ((Fault *)&stack0xfffffffffffffd68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x81c,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                   (char (*) [24])"Unexpected FAR pointer.");
        kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffd68);
        break;
      case OTHER:
        f_10.exception._6_1_ = WirePointer::isCapability(pWStack_50);
        f_10.exception._7_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (bool *)((long)&f_10.exception + 6));
        bVar7 = kj::_::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_10.exception + 7));
        if (bVar7) {
          if ((ptr._7_1_ & 1) != 0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                      ((Fault *)&_cap2091.value.ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x826,FAILED,(char *)0x0,
                       "\"Cannot create a canonical message with a capability\"",
                       (char (*) [52])"Cannot create a canonical message with a capability");
            kj::_::Debug::Fault::~Fault((Fault *)&_cap2091.value.ptr);
          }
          pWVar2 = src_local;
          uVar12 = DirectWireValue<unsigned_int>::get
                             ((DirectWireValue<unsigned_int> *)&(pWStack_50->field_1).structRef);
          (**(code **)*pWVar2)
                    ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&cap,pWVar2,uVar12);
          kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>
                    ((_ *)local_2c0,(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&cap);
          kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe
                    ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&cap);
          pOVar16 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_2c0);
          if (pOVar16 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                      (&local_2e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x831,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\""
                       ,(char (*) [46])"Message contained invalid capability pointer.");
            f_12.exception._4_4_ = 2;
            kj::_::Debug::Fault::~Fault(&local_2e8);
          }
          else {
            pOVar16 = kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::operator*
                                ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_2c0);
            pCVar6 = dstCapTable_local;
            pWVar2 = dst_local;
            pSVar4 = srcSegment_local;
            pOVar16 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>(pOVar16);
            setCapabilityPointer
                      ((SegmentBuilder *)pCVar6,(CapTableBuilder *)pWVar2,(WirePointer *)pSVar4,
                       pOVar16);
            local_18 = (word *)0x1;
            dstSegment_local = (SegmentBuilder *)dstCapTable_local;
            f_12.exception._4_4_ = 1;
          }
          kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::~OwnOwn
                    ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_2c0);
          if (f_12.exception._4_4_ == 1) {
            return _dstSegment_local;
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
                    (&f_11,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x821,FAILED,"src->isCapability()","_kjCondition,\"Unknown pointer type.\"",
                     (DebugExpression<bool> *)((long)&f_10.exception + 7),
                     (char (*) [22])"Unknown pointer type.");
          kj::_::Debug::Fault::~Fault(&f_11);
        }
        break;
      default:
        kj::_::unreachable();
      }
    }
  }
  bVar7 = WirePointer::isNull((WirePointer *)srcSegment_local);
  if (!bVar7) {
    zeroObject((SegmentBuilder *)dstCapTable_local,(CapTableBuilder *)dst_local,
               (WirePointer *)srcSegment_local);
    zeroMemory((WirePointer *)srcSegment_local);
  }
  local_18 = (word *)0x0;
  dstSegment_local = (SegmentBuilder *)dstCapTable_local;
  return _dstSegment_local;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_SOME(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = &p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_SOME(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }